

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::initialize(DeepScanLineOutputFile *this,Header *header)

{
  int iVar1;
  int iVar2;
  Format FVar3;
  int iVar4;
  Box2i *pBVar5;
  LineOrder *pLVar6;
  Compression *pCVar7;
  Compressor *pCVar8;
  LineBuffer *this_00;
  pointer ppLVar9;
  Data *pDVar10;
  ulong uVar11;
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)DEEPSCANLINE_abi_cxx11_);
  pBVar5 = Header::dataWindow(header);
  pLVar6 = Header::lineOrder(header);
  iVar4 = (pBVar5->min).y;
  iVar1 = (pBVar5->max).y;
  iVar2 = iVar1;
  if (*pLVar6 == INCREASING_Y) {
    iVar2 = iVar4;
  }
  pDVar10 = this->_data;
  pDVar10->currentScanLine = iVar2;
  pDVar10->missingScanLines = (iVar1 - iVar4) + 1;
  pLVar6 = Header::lineOrder(header);
  pDVar10 = this->_data;
  pDVar10->lineOrder = *pLVar6;
  iVar4 = (pBVar5->min).y;
  iVar1 = (pBVar5->max).x;
  iVar2 = (pBVar5->max).y;
  pDVar10->minX = (pBVar5->min).x;
  pDVar10->maxX = iVar1;
  pDVar10->minY = iVar4;
  pDVar10->maxY = iVar2;
  Array<unsigned_int>::resizeErase(&pDVar10->lineSampleCount,(long)((iVar2 - iVar4) + 1));
  pCVar7 = Header::compression(&this->_data->header);
  pCVar8 = newCompressor(*pCVar7,0,&this->_data->header);
  FVar3 = defaultFormat(pCVar8);
  this->_data->format = FVar3;
  iVar4 = numLinesInBuffer(pCVar8);
  pDVar10 = this->_data;
  pDVar10->linesInBuffer = iVar4;
  if (pCVar8 != (Compressor *)0x0) {
    (*pCVar8->_vptr_Compressor[1])(pCVar8);
    pDVar10 = this->_data;
    iVar4 = pDVar10->linesInBuffer;
  }
  iVar4 = ((pDVar10->maxY - pDVar10->minY) + iVar4) / iVar4;
  Header::setChunkCount(&pDVar10->header,iVar4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_data->lineOffsets,(long)iVar4);
  pDVar10 = this->_data;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pDVar10->bytesPerLine,(long)((pDVar10->maxY - pDVar10->minY) + 1));
  pDVar10 = this->_data;
  iVar4 = (pDVar10->maxY - pDVar10->minY) + 1;
  if (pDVar10->linesInBuffer <= iVar4) {
    iVar4 = pDVar10->linesInBuffer;
  }
  pDVar10->maxSampleCountTableSize = (long)(((pDVar10->maxX - pDVar10->minX) + 1) * iVar4) << 2;
  ppLVar9 = (pDVar10->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(pDVar10->lineBuffers).
                             super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar9 >> 3);
      uVar11 = uVar11 + 1) {
    this_00 = (LineBuffer *)operator_new(200);
    iVar4 = pDVar10->linesInBuffer;
    (this_00->exception).field_2._M_allocated_capacity = 0;
    *(undefined8 *)&this_00->field_0x70 = 0;
    *(undefined2 *)&this_00->field_0x78 = 0;
    this_00->endOfLineBufferData = (char *)0x0;
    (this_00->buffer)._size = 0;
    (this_00->buffer)._data = (char *)0x0;
    this_00->dataPtr = (char *)0x0;
    this_00->dataSize = 0;
    *(undefined4 *)&this_00->field_0x1c = 0;
    this_00->scanLineMin = 0;
    this_00->scanLineMax = 0;
    this_00->compressor = (Compressor *)0x0;
    this_00->partiallyFull = false;
    this_00->hasException = false;
    *(undefined6 *)&this_00->field_0x42 = 0;
    (this_00->exception)._M_dataplus = (pointer)0x0;
    *(LineBuffer **)&this_00->field_0x80 = this_00 + 1;
    *(undefined8 *)&this_00->field_0x88 = 0;
    *(undefined1 *)&this_00[1].buffer._size = 0;
    IlmThread_2_5::Semaphore::Semaphore((Semaphore *)&this_00[1].dataPtr,1);
    Array<Imf_2_5::Array<char>_>::resizeErase((Array<Imf_2_5::Array<char>_> *)this_00,(long)iVar4);
    (this->_data->lineBuffers).
    super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar11] = this_00;
    Array<char>::resizeErase
              ((Array<char> *)
               &(this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11]->compressor,
               this->_data->maxSampleCountTableSize);
    pCVar7 = Header::compression(&this->_data->header);
    pCVar8 = newCompressor(*pCVar7,this->_data->maxSampleCountTableSize,&this->_data->header);
    pDVar10 = this->_data;
    ppLVar9 = (pDVar10->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (ppLVar9[uVar11]->exception).field_2._M_allocated_capacity = (size_type)pCVar8;
  }
  return;
}

Assistant:

void
DeepScanLineOutputFile::initialize (const Header &header)
{
    _data->header = header;

    _data->header.setType(DEEPSCANLINE);
    
    const Box2i &dataWindow = header.dataWindow();

    _data->currentScanLine = (header.lineOrder() == INCREASING_Y)?
                                 dataWindow.min.y: dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder = header.lineOrder();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    _data->lineSampleCount.resizeErase(_data->maxY - _data->minY + 1);

    Compressor* compressor = newCompressor (_data->header.compression(),
                                            0,
                                            _data->header);
    _data->format = defaultFormat (compressor);
    _data->linesInBuffer = numLinesInBuffer (compressor);
    if (compressor != 0)
        delete compressor;

    int lineOffsetSize = (_data->maxY - _data->minY +
                          _data->linesInBuffer) / _data->linesInBuffer;


    _data->header.setChunkCount(lineOffsetSize);

    _data->lineOffsets.resize (lineOffsetSize);

    _data->bytesPerLine.resize (_data->maxY - _data->minY + 1);

    _data->maxSampleCountTableSize = min(_data->linesInBuffer, _data->maxY - _data->minY + 1) *
                                     (_data->maxX - _data->minX + 1) *
                                     sizeof(unsigned int);

    for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (_data->linesInBuffer);
        _data->lineBuffers[i]->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

        _data->lineBuffers[i]->sampleCountTableCompressor =
        newCompressor (_data->header.compression(),
                               _data->maxSampleCountTableSize,
                               _data->header);
    }
}